

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O0

node_ptr __thiscall
dtc::fdt::device_tree::create_fragment_wrapper(device_tree *this,node_ptr *node,int *fragnum)

{
  element_type *peVar1;
  element_type *this_00;
  int *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  node_ptr nVar2;
  undefined1 local_238 [8];
  node_ptr fragment;
  string local_1c8 [32];
  undefined1 local_1a8 [8];
  shared_ptr<dtc::fdt::property> prop;
  string propname;
  undefined1 local_158 [8];
  property_value v;
  string local_f0;
  undefined1 local_d0 [8];
  node_ptr wrapper;
  string local_b8;
  byte local_91;
  undefined1 local_90 [8];
  vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
  symbols;
  string local_68;
  undefined1 local_48 [8];
  string fragment_address;
  int *fragnum_local;
  node_ptr *node_local;
  device_tree *this_local;
  node_ptr *newroot;
  
  fragment_address.field_2._8_8_ = in_RCX;
  std::__cxx11::to_string(&local_68,*in_RCX);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 "fragment@",&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  *(int *)fragment_address.field_2._8_8_ = *(int *)fragment_address.field_2._8_8_ + 1;
  std::
  vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
  ::vector((vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
            *)local_90);
  local_91 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"",
             (allocator<char> *)
             ((long)&wrapper.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  fdt::node::create_special_node
            ((node *)this,&local_b8,
             (vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
              *)local_90);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&wrapper.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"__overlay__",(allocator<char> *)&v.field_0x5f);
  fdt::node::create_special_node
            ((node *)local_d0,&local_f0,
             (vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
              *)local_90);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&v.field_0x5f);
  std::__cxx11::string::string((string *)(propname.field_2._M_local_buf + 8));
  property_value::property_value
            ((property_value *)local_158,(string *)(propname.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(propname.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             &prop.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  peVar1 = std::__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)fragnum);
  std::__cxx11::string::operator=
            ((string *)(v.label.field_2._M_local_buf + 8),(string *)&peVar1->name);
  peVar1 = std::__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)fragnum);
  if ((peVar1->name_is_path_reference & 1U) == 0) {
    std::__cxx11::string::operator=
              ((string *)
               &prop.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               "target");
    v.byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
  }
  else {
    std::__cxx11::string::operator=
              ((string *)
               &prop.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               "target-path");
    v.byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  std::__cxx11::string::string
            (local_1c8,
             (string *)
             &prop.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::make_shared<dtc::fdt::property,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  std::__cxx11::string::~string(local_1c8);
  this_00 = std::__shared_ptr_access<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_1a8);
  property_value::property_value
            ((property_value *)
             &fragment.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (property_value *)local_158);
  property::add_value(this_00,(property_value *)
                              &fragment.
                               super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
  property_value::~property_value
            ((property_value *)
             &fragment.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
  ::push_back((vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
               *)local_90,(value_type *)local_1a8);
  fdt::node::create_special_node
            ((node *)local_238,(string *)local_48,
             (vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
              *)local_90);
  peVar1 = std::__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_d0);
  fdt::node::merge_node(peVar1,(node_ptr *)fragnum);
  peVar1 = std::__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_238);
  fdt::node::add_child(peVar1,(node_ptr *)local_d0);
  peVar1 = std::__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  fdt::node::add_child(peVar1,(node_ptr *)local_238);
  local_91 = 1;
  std::shared_ptr<dtc::fdt::node>::~shared_ptr((shared_ptr<dtc::fdt::node> *)local_238);
  std::shared_ptr<dtc::fdt::property>::~shared_ptr((shared_ptr<dtc::fdt::property> *)local_1a8);
  std::__cxx11::string::~string
            ((string *)
             &prop.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  property_value::~property_value((property_value *)local_158);
  std::shared_ptr<dtc::fdt::node>::~shared_ptr((shared_ptr<dtc::fdt::node> *)local_d0);
  if ((local_91 & 1) == 0) {
    std::shared_ptr<dtc::fdt::node>::~shared_ptr((shared_ptr<dtc::fdt::node> *)this);
  }
  std::
  vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
  ::~vector((vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
             *)local_90);
  std::__cxx11::string::~string((string *)local_48);
  nVar2.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  nVar2.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (node_ptr)nVar2.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

node_ptr
device_tree::create_fragment_wrapper(node_ptr &node, int &fragnum)
{
	// In a plugin, we can massage these non-/ root nodes into into a fragment
	std::string fragment_address = "fragment@" + std::to_string(fragnum);
	++fragnum;

	std::vector<property_ptr> symbols;

	// Intentionally left empty
	node_ptr newroot = node::create_special_node("", symbols);
	node_ptr wrapper = node::create_special_node("__overlay__", symbols);

	// Generate the fragment with $propname = <&name>
	property_value v;
	std::string propname;
	v.string_data = node->name;
	if (!node->name_is_path_reference)
	{
		propname = "target";
		v.type = property_value::PHANDLE;
	}
	else
	{
		propname = "target-path";
		v.type = property_value::STRING;
	}
	auto prop = std::make_shared<property>(std::string(propname));
	prop->add_value(v);
	symbols.push_back(prop);

	node_ptr fragment = node::create_special_node(fragment_address, symbols);

	wrapper->merge_node(node);
	fragment->add_child(std::move(wrapper));
	newroot->add_child(std::move(fragment));
	return newroot;
}